

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O3

void __thiscall
HighsPrimalHeuristics::RINS
          (HighsPrimalHeuristics *this,vector<double,_std::allocator<double>_> *relaxationsol)

{
  int64_t *piVar1;
  double *pdVar2;
  double dVar3;
  HighsMipSolver *pHVar4;
  int *piVar5;
  pointer pdVar6;
  undefined1 auVar7 [16];
  bool *pbVar8;
  HighsPrimalHeuristics *pHVar9;
  HighsDomain *pHVar10;
  bool bVar11;
  pointer piVar12;
  pair<int,_double> *ppVar13;
  int64_t iVar14;
  int iVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  HighsInt targetDepth;
  pointer ppVar17;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var18;
  long lVar19;
  pair<int,_double> *ppVar20;
  iterator __beg;
  int *piVar21;
  HighsLpRelaxation *pHVar22;
  int *piVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  begin;
  size_t sVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  anon_class_16_2_405d1b53 comp;
  undefined1 in_stack_ffffffffffffa578;
  bool fixtolpsol;
  double local_5a80;
  double local_5a78;
  int local_5a6c;
  vector<double,_std::allocator<double>_> *local_5a68;
  double local_5a60;
  anon_class_32_4_ffb23deb getFixVal;
  HeuristicNeighbourhood neighbourhood;
  vector<double,_std::allocator<double>_> local_59a8;
  vector<double,_std::allocator<double>_> local_5990;
  HighsSearch heur;
  HighsPseudocost pscost;
  HighsLpRelaxation heurlp;
  
  pHVar4 = this->mipsolver;
  _Var18._M_head_impl =
       (pHVar4->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  if (*(bool *)((long)&(_Var18._M_head_impl)->domain + 0x280) != false) {
    return;
  }
  if ((long)(relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(relaxationsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)pHVar4->model_->num_col_) {
    return;
  }
  piVar21 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar25 = (long)piVar5 - (long)piVar21;
  if (0 < (long)uVar25 >> 4) {
    lVar26 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var18._M_head_impl)->domain + 0x308))->
                       super__Vector_base<double,_std::allocator<double>_>;
    lVar19 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var18._M_head_impl)->domain + 800))->
                       super__Vector_base<double,_std::allocator<double>_>;
    piVar23 = (int *)((uVar25 & 0xfffffffffffffff0) + (long)piVar21);
    lVar24 = ((long)uVar25 >> 4) + 1;
    piVar21 = piVar21 + 2;
    do {
      dVar31 = *(double *)(lVar26 + (long)piVar21[-2] * 8);
      pdVar2 = (double *)(lVar19 + (long)piVar21[-2] * 8);
      if ((dVar31 == *pdVar2) && (!NAN(dVar31) && !NAN(*pdVar2))) {
        piVar21 = piVar21 + -2;
        goto LAB_002d4176;
      }
      dVar31 = *(double *)(lVar26 + (long)piVar21[-1] * 8);
      pdVar2 = (double *)(lVar19 + (long)piVar21[-1] * 8);
      if ((dVar31 == *pdVar2) && (!NAN(dVar31) && !NAN(*pdVar2))) {
        piVar21 = piVar21 + -1;
        goto LAB_002d4176;
      }
      dVar31 = *(double *)(lVar26 + (long)*piVar21 * 8);
      pdVar2 = (double *)(lVar19 + (long)*piVar21 * 8);
      if ((dVar31 == *pdVar2) && (!NAN(dVar31) && !NAN(*pdVar2))) goto LAB_002d4176;
      dVar31 = *(double *)(lVar26 + (long)piVar21[1] * 8);
      pdVar2 = (double *)(lVar19 + (long)piVar21[1] * 8);
      if ((dVar31 == *pdVar2) && (!NAN(dVar31) && !NAN(*pdVar2))) {
        piVar21 = piVar21 + 1;
        goto LAB_002d4176;
      }
      lVar24 = lVar24 + -1;
      piVar21 = piVar21 + 4;
    } while (1 < lVar24);
    uVar25 = (long)piVar5 - (long)piVar23;
    piVar21 = piVar23;
  }
  lVar26 = (long)uVar25 >> 2;
  if (lVar26 == 3) {
    lVar26 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var18._M_head_impl)->domain + 0x308))->
                       super__Vector_base<double,_std::allocator<double>_>;
    lVar19 = *(long *)&((vector<double,_std::allocator<double>_> *)
                       ((long)&(_Var18._M_head_impl)->domain + 800))->
                       super__Vector_base<double,_std::allocator<double>_>;
    dVar31 = *(double *)(lVar26 + (long)*piVar21 * 8);
    pdVar2 = (double *)(lVar19 + (long)*piVar21 * 8);
    if ((dVar31 != *pdVar2) || (NAN(dVar31) || NAN(*pdVar2))) {
      piVar21 = piVar21 + 1;
      goto LAB_002d413e;
    }
  }
  else {
    if (lVar26 == 2) {
      lVar26 = *(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var18._M_head_impl)->domain + 0x308))->
                         super__Vector_base<double,_std::allocator<double>_>;
      lVar19 = *(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var18._M_head_impl)->domain + 800))->
                         super__Vector_base<double,_std::allocator<double>_>;
LAB_002d413e:
      dVar31 = *(double *)(lVar26 + (long)*piVar21 * 8);
      pdVar2 = (double *)(lVar19 + (long)*piVar21 * 8);
      if ((dVar31 == *pdVar2) && (!NAN(dVar31) && !NAN(*pdVar2))) goto LAB_002d4176;
      piVar21 = piVar21 + 1;
    }
    else {
      if (lVar26 != 1) goto LAB_002d41b4;
      lVar26 = *(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var18._M_head_impl)->domain + 0x308))->
                         super__Vector_base<double,_std::allocator<double>_>;
      lVar19 = *(long *)&((vector<double,_std::allocator<double>_> *)
                         ((long)&(_Var18._M_head_impl)->domain + 800))->
                         super__Vector_base<double,_std::allocator<double>_>;
    }
    dVar31 = *(double *)(lVar26 + (long)*piVar21 * 8);
    pdVar2 = (double *)(lVar19 + (long)*piVar21 * 8);
    if ((dVar31 != *pdVar2) || (NAN(dVar31) || NAN(*pdVar2))) goto LAB_002d41b4;
  }
LAB_002d4176:
  piVar23 = piVar21;
  if (piVar21 != piVar5) {
    while (piVar23 = piVar23 + 1, piVar23 != piVar5) {
      iVar15 = *piVar23;
      dVar31 = *(double *)(lVar26 + (long)iVar15 * 8);
      pdVar2 = (double *)(lVar19 + (long)iVar15 * 8);
      if ((dVar31 != *pdVar2) || (NAN(dVar31) || NAN(*pdVar2))) {
        *piVar21 = iVar15;
        piVar21 = piVar21 + 1;
      }
    }
    if (piVar21 != piVar5) {
      (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar21;
      _Var18._M_head_impl =
           (pHVar4->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    }
  }
LAB_002d41b4:
  HighsPseudocost::HighsPseudocost(&pscost,&(_Var18._M_head_impl)->pseudocost);
  HighsSearch::HighsSearch(&heur,this->mipsolver,&pscost);
  heur.inheuristic = true;
  heur.childselrule = kHybridInferenceCost;
  HighsLpRelaxation::HighsLpRelaxation
            (&heurlp,&((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp);
  HighsLpRelaxation::setObjectiveLimit
            (&heurlp,((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit
            );
  heurlp.adjustSymBranchingCol = false;
  heur.lp = &heurlp;
  Highs::changeColsBounds
            (&heurlp.lpsolver,0,this->mipsolver->model_->num_col_ + -1,
             heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  piVar12 = heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      heur.localdom.changedcolsflags_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[*piVar12] = '\0';
      piVar12 = piVar12 + 1;
    } while (piVar12 !=
             heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           heur.localdom.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  HighsSearch::createNewNode(&heur);
  local_5a80 = determineTargetFixingRate(this);
  HeuristicNeighbourhood::HeuristicNeighbourhood(&neighbourhood,this->mipsolver,&heur.localdom);
  local_5a6c = -1;
  targetDepth = 1;
  local_5a68 = relaxationsol;
LAB_002d42fc:
  pvVar16 = local_5a68;
  neighbourhood.nCheckedChanges = neighbourhood.startCheckedChanges;
  if (neighbourhood.fixedCols.numElements != 0) {
    HighsHashTable<int,_void>::clear(&neighbourhood.fixedCols);
  }
  local_5a6c = local_5a6c + 1;
  if (((int)((ulong)((long)heur.nodestack.
                           super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)heur.nodestack.
                          super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555 +
       heur.depthoffset <= targetDepth) ||
     (bVar11 = HighsSearch::backtrackUntilDepth(&heur,targetDepth), bVar11)) {
LAB_002d4364:
    while (HighsSearch::evaluateNode(&heur),
          heur.nodestack.
          super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].opensubtrees == '\0') {
      if (*(bool *)((long)&((this->mipsolver->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                           domain + 0x280) == true) {
        lVar26 = HighsSearch::getLocalLpIterations(&heur);
        goto LAB_002d4c80;
      }
      bVar11 = HighsSearch::backtrack(&heur,true);
      local_5a6c = local_5a6c + 1;
      if (!bVar11) goto LAB_002d4a0c;
      neighbourhood.nCheckedChanges = neighbourhood.startCheckedChanges;
      if (neighbourhood.fixedCols.numElements != 0) {
        HighsHashTable<int,_void>::clear(&neighbourhood.fixedCols);
      }
    }
    local_5a78 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if ((local_5a80 <= local_5a78) || (9 < local_5a6c)) goto LAB_002d4a0c;
    getFixVal.relaxationsol = pvVar16;
    getFixVal.this = this;
    if (heurlp.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        heurlp.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
LAB_002d44b4:
      getFixVal.localdom = &heur.localdom;
      getFixVal.fixtolpsol = &fixtolpsol;
      fixtolpsol = true;
      local_5a78 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
      piVar21 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this->intcols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar21 != piVar5) {
        dVar31 = (1.0 - local_5a78) * -0.9 + 1.0;
        if (local_5a80 <= dVar31) {
          dVar31 = local_5a80;
        }
        iVar15 = 0;
        do {
          iVar27 = *piVar21;
          lVar26 = (long)iVar27;
          dVar3 = heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar26];
          dVar30 = heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar26];
          if (((dVar3 != dVar30) || (NAN(dVar3) || NAN(dVar30))) &&
             (dVar29 = heurlp.lpsolver.solution_.col_value.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar26],
             _Var18._M_head_impl =
                  (this->mipsolver->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
             ABS(dVar29 - *(double *)
                           (*(long *)&((_Var18._M_head_impl)->incumbent).
                                      super__Vector_base<double,_std::allocator<double>_> +
                           lVar26 * 8)) <= (_Var18._M_head_impl)->feastol)) {
            dVar29 = (double)(long)((double)((ulong)dVar29 & 0x8000000000000000 | 0x3fe0000000000000
                                            ) + dVar29);
            if (dVar3 < dVar29) {
              local_5a60 = dVar29;
              HighsSearch::branchUpwards(&heur,iVar27,dVar29,dVar29 + -0.5);
              HighsDomain::propagate(&heur.localdom);
              iVar15 = iVar15 + 1;
              if (heur.localdom.infeasible_ == true) {
                HighsDomain::conflictAnalysis
                          (&heur.localdom,
                           &((this->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            conflictPool);
                break;
              }
              local_5a78 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
              dVar30 = heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar26];
              dVar29 = local_5a60;
            }
            if (dVar29 < dVar30) {
              HighsSearch::branchDownwards(&heur,iVar27,dVar29,dVar29 + 0.5);
              HighsDomain::propagate(&heur.localdom);
              iVar15 = iVar15 + 1;
              if (heur.localdom.infeasible_ == true) {
                HighsDomain::conflictAnalysis
                          (&heur.localdom,
                           &((this->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            conflictPool);
                break;
              }
              local_5a78 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
            }
            if (dVar31 <= local_5a78) break;
          }
          piVar21 = piVar21 + 1;
        } while (piVar21 != piVar5);
        pvVar16 = local_5a68;
        if (iVar15 != 0) {
          HighsLpRelaxation::flushDomain(&heurlp,&heur.localdom,false);
          goto LAB_002d4364;
        }
      }
      if (0.25 <= local_5a78) goto LAB_002d4a0c;
      fixtolpsol = false;
      begin._M_current =
           heurlp.fractionalints.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pdVar6 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var18._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      lVar26 = *(long *)&((_Var18._M_head_impl)->incumbent).
                         super__Vector_base<double,_std::allocator<double>_>;
      ppVar13 = heurlp.fractionalints.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar20 = heurlp.fractionalints.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar31 = (_Var18._M_head_impl)->feastol;
        begin._M_current = ppVar20;
        while (iVar15 = (begin._M_current)->first,
              ABS(pdVar6[iVar15] - *(double *)(lVar26 + (long)iVar15 * 8)) <= dVar31) {
          begin._M_current = begin._M_current + 1;
          if (begin._M_current == ppVar13) goto LAB_002d445d;
        }
        do {
          ppVar20 = ppVar13;
          ppVar13 = ppVar20 + -1;
          if (ppVar13 == begin._M_current) goto LAB_002d445d;
          iVar27 = ppVar13->first;
        } while (dVar31 < ABS(pdVar6[iVar27] - *(double *)(lVar26 + (long)iVar27 * 8)));
        (begin._M_current)->first = iVar27;
        ppVar13->first = iVar15;
        dVar31 = (begin._M_current)->second;
        (begin._M_current)->second = ppVar20[-1].second;
        ppVar20[-1].second = dVar31;
        ppVar20 = begin._M_current + 1;
      } while (ppVar13 != ppVar20);
      begin._M_current = begin._M_current + 1;
LAB_002d445d:
      fixtolpsol = true;
      getFixVal.fixtolpsol = &fixtolpsol;
      getFixVal.localdom = &heur.localdom;
      if (heurlp.fractionalints.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start == begin._M_current) goto LAB_002d44b4;
    }
    if (heurlp.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != begin._M_current) {
      uVar25 = (long)begin._M_current -
               (long)heurlp.fractionalints.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      pHVar22 = (HighsLpRelaxation *)0x0;
      if (1 < uVar25) {
        pHVar22 = (HighsLpRelaxation *)0x0;
        do {
          uVar25 = (long)uVar25 >> 1;
          pHVar22 = (HighsLpRelaxation *)(ulong)((int)pHVar22 + 1);
        } while (1 < uVar25);
      }
      comp.heurlp = pHVar22;
      comp.getFixVal = (anon_class_32_4_ffb23deb *)&heurlp;
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,HighsPrimalHeuristics::RINS(std::vector<double,std::allocator<double>>const&)::__3,false>
                ((pdqsort_detail *)
                 heurlp.fractionalints.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,begin,(pair<int,_double> *)&getFixVal,
                 comp,1,(bool)in_stack_ffffffffffffa578);
    }
    pHVar10 = getFixVal.localdom;
    pHVar9 = getFixVal.this;
    pvVar16 = getFixVal.relaxationsol;
    pbVar8 = getFixVal.fixtolpsol;
    if (heurlp.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start == begin._M_current) goto LAB_002d4a0c;
    iVar15 = 0;
    dVar31 = 0.0;
    ppVar17 = heurlp.fractionalints.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_002d474c:
    ppVar20 = ppVar17 + 1;
    iVar27 = ppVar17->first;
    dVar3 = ppVar17->second;
    local_5a60 = dVar31;
    if (*pbVar8 == true) {
      dVar30 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar27];
LAB_002d4785:
      dVar30 = dVar30 + 0.5;
LAB_002d478d:
      dVar31 = floor(dVar30);
    }
    else {
      dVar31 = (pHVar9->mipsolver->model_->col_cost_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar27];
      if (dVar31 <= 0.0) {
        dVar30 = dVar3;
        if (0.0 <= dVar31) goto LAB_002d4785;
        goto LAB_002d478d;
      }
      dVar31 = ceil(dVar3);
    }
    dVar30 = (pHVar10->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar27];
    if (dVar30 <= dVar31) {
      dVar31 = dVar30;
    }
    dVar30 = (pHVar10->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar27];
    if (dVar31 <= dVar30) {
      dVar31 = dVar30;
    }
    if (heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar27] <= dVar31 &&
        dVar31 != heur.localdom.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar27]) {
      HighsSearch::branchUpwards(&heur,iVar27,dVar31,dVar3);
      iVar15 = iVar15 + 1;
      if (heur.localdom.infeasible_ == true) {
        HighsDomain::conflictAnalysis
                  (&heur.localdom,
                   &((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool
                  );
LAB_002d4936:
        pvVar16 = local_5a68;
        if (iVar15 == 0) goto LAB_002d4a0c;
        HighsLpRelaxation::flushDomain(&heurlp,&heur.localdom,false);
        goto LAB_002d4364;
      }
      local_5a78 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
      iVar27 = ppVar17->first;
    }
    if (dVar31 < heur.localdom.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar27]) {
      HighsSearch::branchDownwards(&heur,iVar27,dVar31,ppVar17->second);
      iVar15 = iVar15 + 1;
      if (heur.localdom.infeasible_ == true) {
        HighsDomain::conflictAnalysis
                  (&heur.localdom,
                   &((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool
                  );
        goto LAB_002d4936;
      }
      local_5a78 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    }
    if (((local_5a80 <= local_5a78) ||
        (dVar31 = local_5a60 + ABS(dVar31 - ppVar17->second), 0.5 <= dVar31)) ||
       (ppVar17 = ppVar20, ppVar20 == begin._M_current)) goto LAB_002d4936;
    goto LAB_002d474c;
  }
  lVar26 = HighsSearch::getLocalLpIterations(&heur);
  goto LAB_002d4c80;
LAB_002d4a0c:
  if (heur.nodestack.
      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
      super__Vector_impl_data._M_start ==
      heur.nodestack.
      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar26 = HighsSearch::getLocalLpIterations(&heur);
  }
  else {
    local_5a80 = HeuristicNeighbourhood::getFixingRate(&neighbourhood);
    if ((local_5a80 < 0.1) ||
       ((this->mipsolver->submip == true &&
        (((this->mipsolver->mipdata_)._M_t.
          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
          super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numImprovingSols != 0)))
       ) {
      HighsSearch::setMinReliable(&heur,0);
      HighsSearch::solveDepthFirst(&heur,10);
      iVar14 = HighsSearch::getLocalLpIterations(&heur);
      this->lp_iterations = this->lp_iterations + iVar14;
      if (this->mipsolver->submip == true) {
        iVar14 = HighsSearch::getLocalNodes(&heur);
        piVar1 = &((this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes;
        *piVar1 = *piVar1 + iVar14;
      }
      goto LAB_002d4c84;
    }
    HighsLpRelaxation::removeObsoleteRows(&heurlp,false);
    std::vector<double,_std::allocator<double>_>::vector(&local_59a8,&heur.localdom.col_lower_);
    std::vector<double,_std::allocator<double>_>::vector(&local_5990,&heur.localdom.col_upper_);
    auVar7 = SEXT816(0x6666666666666667) *
             SEXT816(((this->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->num_nodes);
    bVar11 = solveSubMip(this,&heurlp.lpsolver.model_.lp_,&heurlp.lpsolver.basis_,local_5a80,
                         &local_59a8,&local_5990,500,
                         ((int)(auVar7._8_8_ >> 3) - (auVar7._12_4_ >> 0x1f)) + 200,0xc);
    if (local_5990.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5990.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_59a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_59a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (!bVar11) {
      sVar28 = this->lp_iterations;
      iVar14 = HighsSearch::getLocalLpIterations(&heur);
      sVar28 = iVar14 + sVar28;
      _Var18._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if (((((_Var18._M_head_impl)->total_lp_iterations -
             ((_Var18._M_head_impl)->heuristic_lp_iterations +
             (_Var18._M_head_impl)->sb_lp_iterations) >> 1) + 100000 <
            (long)((_Var18._M_head_impl)->heuristic_lp_iterations + sVar28)) ||
          (iVar15 = (int)((ulong)((long)heur.nodestack.
                                        super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)heur.nodestack.
                                       super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                    -0x55555555 + heur.depthoffset, iVar15 < 4)) ||
         (bVar11 = HighsMipSolverData::checkLimits(_Var18._M_head_impl,0), bVar11)) {
        this->lp_iterations = sVar28;
LAB_002d4c84:
        HighsHashTable<int,_void>::~HighsHashTable(&neighbourhood.fixedCols);
        HighsLpRelaxation::~HighsLpRelaxation(&heurlp);
        HighsHashTable<int,_int>::~HighsHashTable(&heur.reliableatnode);
        std::vector<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>::~vector
                  (&heur.nodestack);
        if (heur.subrootsol.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(heur.subrootsol.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (heur.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(heur.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (heur.inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(heur.inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        HighsDomain::~HighsDomain(&heur.localdom);
        HighsPseudocost::~HighsPseudocost(&pscost);
        return;
      }
      targetDepth = iVar15 / 2;
      local_5a80 = local_5a80 * 0.5;
      goto LAB_002d42fc;
    }
    lVar26 = HighsSearch::getLocalLpIterations(&heur);
  }
LAB_002d4c80:
  this->lp_iterations = this->lp_iterations + lVar26;
  goto LAB_002d4c84;
}

Assistant:

void HighsPrimalHeuristics::RINS(const std::vector<double>& relaxationsol) {
  // return if domain is infeasible
  if (mipsolver.mipdata_->domain.infeasible()) return;

  if (relaxationsol.size() != static_cast<size_t>(mipsolver.numCol())) return;

  intcols.erase(std::remove_if(intcols.begin(), intcols.end(),
                               [&](HighsInt i) {
                                 return mipsolver.mipdata_->domain.isFixed(i);
                               }),
                intcols.end());

  HighsPseudocost pscost(mipsolver.mipdata_->pseudocost);
  HighsSearch heur(mipsolver, pscost);
  HighsDomain& localdom = heur.getLocalDomain();
  heur.setHeuristic(true);

  HighsLpRelaxation heurlp(mipsolver.mipdata_->lp);
  // only use the global upper limit as LP limit so that dual proofs are valid
  heurlp.setObjectiveLimit(mipsolver.mipdata_->upper_limit);
  heurlp.setAdjustSymmetricBranchingCol(false);
  heur.setLpRelaxation(&heurlp);

  heurlp.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                        localdom.col_lower_.data(),
                                        localdom.col_upper_.data());
  localdom.clearChangedCols();
  heur.createNewNode();

  // determine the initial number of unfixed variables fixing rate to decide if
  // the problem is restricted enough to be considered for solving a submip
  double maxfixingrate = determineTargetFixingRate();
  double minfixingrate = 0.25;
  double fixingrate = 0.0;
  bool stop = false;
  HighsInt nbacktracks = -1;
  HighsInt targetdepth = 1;
  HeuristicNeighbourhood neighbourhood(mipsolver, localdom);
retry:
  ++nbacktracks;
  neighbourhood.backtracked();
  // printf("current depth : %" HIGHSINT_FORMAT "   target depth : %"
  // HIGHSINT_FORMAT "\n", heur.getCurrentDepth(),
  //       targetdepth);
  if (heur.getCurrentDepth() > targetdepth) {
    if (!heur.backtrackUntilDepth(targetdepth)) {
      lp_iterations += heur.getLocalLpIterations();
      return;
    }
  }

  assert(heur.hasNode());

  while (true) {
    heur.evaluateNode();
    if (heur.currentNodePruned()) {
      ++nbacktracks;
      // printf("backtrack1\n");
      if (mipsolver.mipdata_->domain.infeasible()) {
        lp_iterations += heur.getLocalLpIterations();
        return;
      }

      if (!heur.backtrack()) break;
      neighbourhood.backtracked();
      continue;
    }

    fixingrate = neighbourhood.getFixingRate();

    if (stop) break;
    if (fixingrate >= maxfixingrate) break;
    if (nbacktracks >= 10) break;

    std::vector<std::pair<HighsInt, double>>::iterator fixcandend;

    // partition the fractional variables to consider which ones should we fix
    // in this dive first if there is an incumbent, we dive towards the RINS
    // neighbourhood
    fixcandend = std::partition(
        heurlp.getFractionalIntegers().begin(),
        heurlp.getFractionalIntegers().end(),
        [&](const std::pair<HighsInt, double>& fracvar) {
          return std::abs(relaxationsol[fracvar.first] -
                          mipsolver.mipdata_->incumbent[fracvar.first]) <=
                 mipsolver.mipdata_->feastol;
        });

    bool fixtolpsol = true;

    auto getFixVal = [&](HighsInt col, double fracval) {
      double fixval;
      if (fixtolpsol) {
        // RINS neighbourhood (with extension)
        fixval = std::floor(relaxationsol[col] + 0.5);
      } else {
        // reinforce direction of this solution away from root
        // solution if the change is at least 0.4
        // otherwise take the direction where the objective gets worse
        // if objective is zero round to nearest integer
        double rootchange = fracval - mipsolver.mipdata_->rootlpsol[col];
        if (rootchange >= 0.4)
          fixval = std::ceil(fracval);
        else if (rootchange <= -0.4)
          fixval = std::floor(fracval);
        if (mipsolver.model_->col_cost_[col] > 0.0)
          fixval = std::ceil(fracval);
        else if (mipsolver.model_->col_cost_[col] < 0.0)
          fixval = std::floor(fracval);
        else
          fixval = std::floor(fracval + 0.5);
      }
      // make sure we do not set an infeasible domain
      fixval = std::min(localdom.col_upper_[col], fixval);
      fixval = std::max(localdom.col_lower_[col], fixval);
      return fixval;
    };

    // no candidates left to fix for getting to the neighbourhood, therefore we
    // switch to a different diving strategy until the minimal fixing rate is
    // reached
    HighsInt numBranched = 0;
    if (heurlp.getFractionalIntegers().begin() == fixcandend) {
      fixingrate = neighbourhood.getFixingRate();
      double stopFixingRate =
          std::min(maxfixingrate, 1.0 - (1.0 - fixingrate) * 0.9);
      const auto& currlpsol = heurlp.getSolution().col_value;
      for (HighsInt i : intcols) {
        if (localdom.col_lower_[i] == localdom.col_upper_[i]) continue;

        if (std::abs(currlpsol[i] - mipsolver.mipdata_->incumbent[i]) <=
            mipsolver.mipdata_->feastol) {
          double fixval = HighsIntegers::nearestInteger(currlpsol[i]);
          if (localdom.col_lower_[i] < fixval) {
            ++numBranched;
            heur.branchUpwards(i, fixval, fixval - 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }
          if (localdom.col_upper_[i] > fixval) {
            ++numBranched;
            heur.branchDownwards(i, fixval, fixval + 0.5);
            localdom.propagate();
            if (localdom.infeasible()) {
              localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
              break;
            }

            fixingrate = neighbourhood.getFixingRate();
          }

          if (fixingrate >= stopFixingRate) break;
        }
      }

      if (numBranched != 0) {
        // printf(
        //    "fixed %" HIGHSINT_FORMAT " additional cols, old fixing rate:
        //    %.2f%%, new fixing " "rate: %.2f%%\n", numBranched, fixingrate,
        //    getFixingRate());
        heurlp.flushDomain(localdom);
        continue;
      }

      if (fixingrate >= minfixingrate)
        break;  // if the RINS neighbourhood achieved a high enough fixing rate
                // by itself we stop here
      fixcandend = heurlp.getFractionalIntegers().end();
      // now sort the variables by their distance towards the value they will
      // be fixed to
      fixtolpsol = false;
    }

    // now sort the variables by their distance towards the value they will be
    // fixed to
    pdqsort(heurlp.getFractionalIntegers().begin(), fixcandend,
            [&](const std::pair<HighsInt, double>& a,
                const std::pair<HighsInt, double>& b) {
              return std::make_pair(
                         std::abs(getFixVal(a.first, a.second) - a.second),
                         HighsHashHelpers::hash(
                             (uint64_t(a.first) << 32) +
                             heurlp.getFractionalIntegers().size())) <
                     std::make_pair(
                         std::abs(getFixVal(b.first, b.second) - b.second),
                         HighsHashHelpers::hash(
                             (uint64_t(b.first) << 32) +
                             heurlp.getFractionalIntegers().size()));
            });

    double change = 0.0;
    // select a set of fractional variables to fix
    for (auto fracint = heurlp.getFractionalIntegers().begin();
         fracint != fixcandend; ++fracint) {
      double fixval = getFixVal(fracint->first, fracint->second);

      if (localdom.col_lower_[fracint->first] < fixval) {
        ++numBranched;
        heur.branchUpwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (localdom.col_upper_[fracint->first] > fixval) {
        ++numBranched;
        heur.branchDownwards(fracint->first, fixval, fracint->second);
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          break;
        }

        fixingrate = neighbourhood.getFixingRate();
      }

      if (fixingrate >= maxfixingrate) break;

      change += std::abs(fixval - fracint->second);
      if (change >= 0.5) break;
    }

    if (numBranched == 0) break;

    heurlp.flushDomain(localdom);

    // printf("%" HIGHSINT_FORMAT "/%" HIGHSINT_FORMAT " fixed, fixingrate is
    // %g\n", nfixed, ntotal, fixingrate);
  }

  // if there is no node left it means we backtracked to the global domain and
  // the subproblem was solved with the dive
  if (!heur.hasNode()) {
    lp_iterations += heur.getLocalLpIterations();
    return;
  }
  // determine the fixing rate to decide if the problem is restricted enough
  // to be considered for solving a submip

  // printf("fixing rate is %g\n", fixingrate);
  fixingrate = neighbourhood.getFixingRate();
  if (fixingrate < 0.1 ||
      (mipsolver.submip && mipsolver.mipdata_->numImprovingSols != 0)) {
    // heur.childselrule = ChildSelectionRule::kBestCost;
    heur.setMinReliable(0);
    heur.solveDepthFirst(10);
    lp_iterations += heur.getLocalLpIterations();
    if (mipsolver.submip) mipsolver.mipdata_->num_nodes += heur.getLocalNodes();
    // lpiterations += heur.lpiterations;
    // pseudocost = heur.pseudocost;
    return;
  }

  heurlp.removeObsoleteRows(false);
  const bool solve_sub_mip_return =
      solveSubMip(heurlp.getLp(), heurlp.getLpSolver().getBasis(), fixingrate,
                  localdom.col_lower_, localdom.col_upper_,
                  500,  // std::max(50, int(0.05 *
                  // (mipsolver.mipdata_->num_leaves))),
                  200 + mipsolver.mipdata_->num_nodes / 20, 12);
  if (!solve_sub_mip_return) {
    int64_t new_lp_iterations = lp_iterations + heur.getLocalLpIterations();
    if (new_lp_iterations + mipsolver.mipdata_->heuristic_lp_iterations >
        100000 + ((mipsolver.mipdata_->total_lp_iterations -
                   mipsolver.mipdata_->heuristic_lp_iterations -
                   mipsolver.mipdata_->sb_lp_iterations) >>
                  1)) {
      lp_iterations = new_lp_iterations;
      return;
    }

    targetdepth = heur.getCurrentDepth() / 2;
    if (targetdepth <= 1 || mipsolver.mipdata_->checkLimits()) {
      lp_iterations = new_lp_iterations;
      return;
    }
    // printf("infeasible in root node, trying with lower fixing rate\n");
    maxfixingrate = fixingrate * 0.5;
    goto retry;
  }

  lp_iterations += heur.getLocalLpIterations();
}